

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

void __thiscall LogStream::formatInteger<unsigned_long_long>(LogStream *this,unsigned_long_long v)

{
  int iVar1;
  size_t len_00;
  char *in_RSI;
  FixedBuffer<4000> *in_RDI;
  size_t len;
  unsigned_long_long in_stack_ffffffffffffffe8;
  
  iVar1 = FixedBuffer<4000>::avail(in_RDI);
  if (0x1f < iVar1) {
    FixedBuffer<4000>::current((FixedBuffer<4000> *)(in_RDI->data_ + 8));
    len_00 = convert<unsigned_long_long>(in_RSI,in_stack_ffffffffffffffe8);
    FixedBuffer<4000>::add((FixedBuffer<4000> *)(in_RDI->data_ + 8),len_00);
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v){
    // buffer容不下kMaxNumericSize个字符的话会被直接丢弃 
    if(buffer_.avail() >= kMaxNumericSize){
        size_t len = convert(buffer_.current(), v);
        buffer_.add(len);
    }
}